

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::AddNodeToGraph
          (Discreet3DSImporter *this,aiScene *pcSOut,aiNode *pcOut,Node *pcIn,aiMatrix4x4 *param_4)

{
  char *pcVar1;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *this_00;
  aiVector3D *paVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  float fVar19;
  uint uVar20;
  aiColor4D *paVar21;
  size_t __n;
  size_t sVar22;
  aiMesh *paVar23;
  pointer pcVar24;
  pointer paVar25;
  aiAnimation *paVar26;
  aiCamera *paVar27;
  aiLight *paVar28;
  bool bVar29;
  pointer puVar30;
  undefined8 uVar31;
  int iVar32;
  iterator it;
  uint *puVar33;
  Logger *pLVar34;
  aiVector3D *paVar35;
  pointer paVar36;
  pointer paVar37;
  aiNodeAnim *paVar38;
  aiVectorKey *paVar39;
  aiQuatKey *paVar40;
  aiNode **ppaVar41;
  aiNode *this_01;
  ulong uVar42;
  aiVector3D *paVar43;
  pointer paVar44;
  ulong uVar45;
  long lVar46;
  pointer paVar47;
  aiQuatKey *paVar48;
  uint uVar49;
  pointer puVar50;
  aiMatrix4x4 *paVar51;
  char *pcVar52;
  bool bVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar61;
  undefined8 uVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> iArray;
  aiMatrix4x4 mInv;
  char tmp [12];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  aiMatrix4x4t<float> local_e8;
  Discreet3DSImporter *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char local_3c [12];
  
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_a0 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_108,3);
  local_e8._0_8_ = (ulong)(uint)local_e8.a2 << 0x20;
  if (pcSOut->mNumMeshes != 0) {
    uVar42 = 0;
    do {
      paVar21 = pcSOut->mMeshes[uVar42]->mColors[0];
      if (paVar21 == (aiColor4D *)0x0) {
        __assert_fail("__null != pcMesh",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                      ,0x1cb,
                      "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                     );
      }
      __n = (pcIn->mName)._M_string_length;
      sVar22._0_4_ = paVar21[5].r;
      sVar22._4_4_ = paVar21[5].g;
      if ((__n == sVar22) &&
         ((__n == 0 ||
          (iVar32 = bcmp((pcIn->mName)._M_dataplus._M_p,*(void **)&paVar21[4].b,__n), iVar32 == 0)))
         ) {
        if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
        }
        else {
          *local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)uVar42;
          local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar49 = (int)local_e8.a1 + 1;
      uVar42 = (ulong)uVar49;
      local_e8.a1 = (float)uVar49;
    } while (uVar49 < pcSOut->mNumMeshes);
  }
  if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar21 = pcSOut->mMeshes
              [*local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start]->mColors[0];
    local_e8._0_8_ = *(undefined8 *)&paVar21[9].b;
    local_e8.a3 = paVar21[10].r;
    local_e8.a4 = paVar21[10].g;
    local_e8.b1 = paVar21[10].b;
    local_e8.b2 = paVar21[10].a;
    local_e8.b3 = paVar21[0xb].r;
    local_e8.b4 = paVar21[0xb].g;
    local_e8.c1 = paVar21[0xb].b;
    local_e8.c2 = paVar21[0xb].a;
    local_e8.c3 = paVar21[0xc].r;
    local_e8.c4 = paVar21[0xc].g;
    local_e8.d1 = paVar21[0xc].b;
    local_e8.d2 = paVar21[0xc].a;
    local_e8.d3 = paVar21[0xd].r;
    local_e8.d4 = paVar21[0xd].g;
    fVar55 = paVar21[10].r;
    fVar54 = paVar21[0xb].r;
    fVar56 = paVar21[0xc].r;
    local_58._0_4_ = paVar21[9].b;
    local_58._4_4_ = paVar21[9].a;
    uStack_50 = 0;
    local_68._0_4_ = paVar21[10].b;
    local_68._4_4_ = paVar21[10].a;
    uStack_60 = 0;
    local_78._0_4_ = paVar21[0xb].b;
    local_78._4_4_ = paVar21[0xb].a;
    uStack_70 = 0;
    local_88._0_4_ = paVar21[0xc].b;
    local_88._4_4_ = paVar21[0xc].a;
    uStack_80 = 0;
    fVar57 = paVar21[0xd].r;
    aiMatrix4x4t<float>::Inverse(&local_e8);
    puVar30 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    puVar50 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_98._0_4_ = (pcIn->vPivot).x;
    local_98._4_4_ = (pcIn->vPivot).y;
    uStack_90 = 0;
    fVar16 = (pcIn->vPivot).z;
    uVar42 = (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2;
    pcOut->mNumMeshes = (uint)uVar42;
    puVar33 = (uint *)operator_new__(-(ulong)(uVar42 >> 0x3e != 0) |
                                     (long)local_108.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_108.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
    pcOut->mMeshes = puVar33;
    if (puVar30 != puVar50) {
      bVar53 = local_98._4_4_ != 0.0;
      bVar29 = (float)local_98 != 0.0;
      uVar42 = 0;
      fVar19 = (float)local_58;
      fVar62 = local_58._4_4_;
      uVar60 = local_68;
      fVar63 = (float)local_78;
      fVar64 = local_78._4_4_;
      fVar58 = (float)local_88;
      fVar59 = local_88._4_4_;
      do {
        uVar49 = puVar50[uVar42];
        paVar23 = pcSOut->mMeshes[uVar49];
        if (paVar23->mColors[1] == (aiColor4D *)0x0) {
          paVar35 = paVar23->mVertices;
          paVar2 = paVar35 + paVar23->mNumVertices;
          if ((ulong)paVar23->mNumVertices != 0) {
            paVar43 = paVar23->mNormals;
            lVar46 = 0;
            do {
              pfVar3 = (float *)((long)&paVar35->x + lVar46);
              fVar61 = *pfVar3;
              fVar5 = pfVar3[1];
              fVar6 = pfVar3[2];
              *(ulong *)pfVar3 =
                   CONCAT44(local_e8.b4 +
                            fVar6 * local_e8.b3 + fVar61 * local_e8.b1 + local_e8.b2 * fVar5,
                            local_e8.a4 +
                            fVar6 * local_e8.a3 + fVar61 * local_e8.a1 + local_e8.a2 * fVar5);
              pfVar3[2] = fVar6 * local_e8.c3 + fVar61 * local_e8.c1 + fVar5 * local_e8.c2 +
                          local_e8.c4;
              fVar61 = *(float *)((long)&paVar43->x + lVar46);
              fVar5 = *(float *)((long)&paVar43->y + lVar46);
              fVar6 = *(float *)((long)&paVar43->z + lVar46);
              *(ulong *)((long)&paVar43->x + lVar46) =
                   CONCAT44(fVar6 * fVar64 +
                            fVar61 * fVar62 + fVar5 * (float)((ulong)uVar60 >> 0x20) + fVar59,
                            fVar6 * fVar63 + fVar61 * fVar19 + fVar5 * (float)uVar60 + fVar58);
              *(float *)((long)&paVar43->z + lVar46) =
                   fVar55 * fVar61 + fVar54 * fVar5 + fVar56 * fVar6 + fVar57;
              lVar46 = lVar46 + 0xc;
            } while ((aiVector3D *)(pfVar3 + 3) != paVar2);
          }
          fVar19 = paVar21[10].a;
          fVar62 = paVar21[9].b;
          fVar63 = paVar21[9].a;
          fVar64 = paVar21[0xc].r;
          fVar58 = paVar21[0xd].g;
          fVar59 = paVar21[0xc].g;
          fVar61 = paVar21[0xd].r;
          fVar5 = paVar21[0xb].r;
          fVar6 = paVar21[0xc].a;
          fVar7 = paVar21[0xb].a;
          fVar8 = paVar21[0xb].g;
          fVar9 = paVar21[0xc].b;
          fVar10 = paVar21[0xb].b;
          fVar11 = paVar21[10].b;
          fVar12 = paVar21[10].r;
          fVar13 = paVar21[10].g;
          if (fVar5 * fVar13 * fVar7 * fVar9 +
              ((fVar19 * fVar13 * fVar10 * fVar61 +
               ((fVar11 * fVar13 * fVar64 * fVar6 +
                (((fVar59 * fVar12 * fVar19 * fVar9 +
                  ((fVar7 * fVar11 * fVar12 * fVar58 +
                   ((fVar10 * fVar8 * fVar12 * fVar6 +
                    fVar63 * fVar11 * fVar59 * fVar61 +
                    ((fVar8 * fVar63 * fVar64 * fVar9 +
                     ((fVar5 * fVar63 * fVar10 * fVar58 +
                      (((fVar7 * fVar62 * fVar8 * fVar61 +
                        ((fVar59 * fVar62 * fVar5 * fVar6 +
                         (fVar62 * fVar19 * fVar64 * fVar58 - fVar59 * fVar62 * fVar19 * fVar61)) -
                        fVar62 * fVar5 * fVar7 * fVar58)) - fVar62 * fVar8 * fVar64 * fVar6) -
                      fVar59 * fVar5 * fVar63 * fVar9)) - fVar10 * fVar8 * fVar63 * fVar61)) -
                    fVar64 * fVar63 * fVar11 * fVar58)) - fVar8 * fVar12 * fVar7 * fVar9)) -
                  fVar11 * fVar12 * fVar59 * fVar6)) - fVar12 * fVar19 * fVar10 * fVar58) -
                fVar7 * fVar11 * fVar13 * fVar61)) - fVar64 * fVar19 * fVar13 * fVar9)) -
              fVar10 * fVar5 * fVar13 * fVar6) < 0.0) {
            paVar35 = paVar23->mVertices;
            if (paVar35 != paVar2) {
              paVar43 = paVar23->mNormals;
              do {
                paVar35->x = -paVar35->x;
                paVar43->x = -paVar43->x;
                paVar35 = paVar35 + 1;
                paVar43 = paVar43 + 1;
              } while (paVar35 != paVar2);
            }
            pLVar34 = DefaultLogger::get();
            Logger::info(pLVar34,"3DS: Flipping mesh X-Axis");
          }
          fVar19 = (float)local_58;
          fVar62 = local_58._4_4_;
          uVar60 = local_68;
          fVar63 = (float)local_78;
          fVar64 = local_78._4_4_;
          fVar58 = (float)local_88;
          fVar59 = local_88._4_4_;
          if (fVar16 != 0.0 || (bVar53 || bVar29)) {
            for (paVar35 = paVar23->mVertices; paVar35 != paVar2; paVar35 = paVar35 + 1) {
              uVar14 = paVar35->x;
              uVar17 = paVar35->y;
              paVar35->x = (float)uVar14 - (float)local_98;
              paVar35->y = (float)uVar17 - local_98._4_4_;
              paVar35->z = paVar35->z - fVar16;
            }
          }
        }
        paVar23->mColors[1] = (aiColor4D *)0x1;
        pcOut->mMeshes[uVar42] = uVar49;
        uVar42 = (ulong)((int)uVar42 + 1);
        puVar50 = local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar42 < (ulong)((long)local_108.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
  }
  uVar42 = (ulong)(uint)pcIn->mInstanceNumber;
  if (pcIn->mInstanceNumber < 2) {
    uVar42 = (pcIn->mName)._M_string_length;
    if (uVar42 < 0x400) {
      (pcOut->mName).length = (ai_uint32)uVar42;
      memcpy((pcOut->mName).data,(pcIn->mName)._M_dataplus._M_p,uVar42);
      (pcOut->mName).data[uVar42] = '\0';
    }
  }
  else {
    uVar49 = 1;
    iVar32 = 1000000000;
    pcVar52 = local_3c;
    paVar51 = (aiMatrix4x4 *)0x0;
    do {
      lVar46 = (long)(int)uVar42 / (long)iVar32;
      bVar53 = (int)lVar46 != 0;
      param_4 = (aiMatrix4x4 *)(ulong)(byte)((byte)paVar51 | iVar32 == 1 | bVar53);
      if ((paVar51 != (aiMatrix4x4 *)0x0 || iVar32 == 1) || bVar53) {
        pcVar1 = pcVar52 + 1;
        *pcVar52 = (char)lVar46 + '0';
        pcVar52 = pcVar1;
        if (iVar32 == 1) break;
        uVar49 = uVar49 + 1;
        uVar42 = (long)(int)uVar42 % (long)iVar32 & 0xffffffff;
      }
      iVar32 = iVar32 / 10;
      paVar51 = param_4;
    } while (uVar49 < 0xc);
    *pcVar52 = '\0';
    pcVar24 = (pcIn->mName)._M_dataplus._M_p;
    local_e8._0_8_ = &local_e8.b1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar24,pcVar24 + (pcIn->mName)._M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    std::__cxx11::string::append((char *)&local_e8);
    uVar31 = local_e8._8_8_;
    uVar60 = local_e8._0_8_;
    if ((ulong)local_e8._8_8_ < 0x400) {
      (pcOut->mName).length = local_e8.a3;
      memcpy((pcOut->mName).data,(void *)local_e8._0_8_,local_e8._8_8_);
      (pcOut->mName).data[uVar31] = '\0';
    }
    if ((float *)uVar60 != &local_e8.b1) {
      operator_delete((void *)uVar60);
    }
  }
  this_00 = &pcIn->aRotationKeys;
  paVar36 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
      super__Vector_impl_data._M_finish == paVar36) {
    paVar37 = (pcIn->aCameraRollKeys).
              super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pcIn->aCameraRollKeys).
        super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar37) {
      fVar55 = paVar37->mValue * -0.017453292;
      (pcOut->mTransformation).a3 = 0.0;
      (pcOut->mTransformation).a4 = 0.0;
      (pcOut->mTransformation).b3 = 0.0;
      (pcOut->mTransformation).b4 = 0.0;
      (pcOut->mTransformation).c1 = 0.0;
      (pcOut->mTransformation).c2 = 0.0;
      (pcOut->mTransformation).c3 = 1.0;
      (pcOut->mTransformation).c4 = 0.0;
      (pcOut->mTransformation).d1 = 0.0;
      (pcOut->mTransformation).d2 = 0.0;
      (pcOut->mTransformation).d3 = 0.0;
      (pcOut->mTransformation).d4 = 1.0;
      fVar54 = cosf(fVar55);
      (pcOut->mTransformation).b2 = fVar54;
      (pcOut->mTransformation).a1 = fVar54;
      fVar55 = sinf(fVar55);
      (pcOut->mTransformation).b1 = fVar55;
      (pcOut->mTransformation).a2 = -fVar55;
    }
  }
  else {
    do {
      (paVar36->mValue).w = -(paVar36->mValue).w;
      paVar36 = paVar36 + 1;
    } while (paVar36 !=
             (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl
             .super__Vector_impl_data._M_finish);
    paVar36 = (this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
              super__Vector_impl_data._M_start;
    fVar55 = (paVar36->mValue).w;
    fVar54 = (paVar36->mValue).z;
    uVar15 = (paVar36->mValue).x;
    uVar18 = (paVar36->mValue).y;
    fVar16 = (float)uVar18 * (float)uVar18 + fVar54 * fVar54;
    fVar19 = (float)uVar15 * (float)uVar18 + -fVar54 * fVar55;
    fVar62 = fVar54 * (float)uVar15 + fVar55 * (float)uVar18;
    fVar63 = (float)uVar15 * (float)uVar18 + fVar54 * fVar55;
    fVar57 = fVar54 * fVar54 + (float)uVar15 * (float)uVar15;
    fVar56 = (float)uVar18 * fVar54 - fVar55 * (float)uVar15;
    fVar64 = (float)uVar18 * (float)uVar18 + (float)uVar15 * (float)uVar15;
    (pcOut->mTransformation).a1 = 1.0 - (fVar16 + fVar16);
    (pcOut->mTransformation).a2 = fVar19 + fVar19;
    (pcOut->mTransformation).a3 = fVar62 + fVar62;
    (pcOut->mTransformation).a4 = 0.0;
    (pcOut->mTransformation).b1 = fVar63 + fVar63;
    (pcOut->mTransformation).b2 = 1.0 - (fVar57 + fVar57);
    (pcOut->mTransformation).b3 = fVar56 + fVar56;
    (pcOut->mTransformation).b4 = 0.0;
    fVar56 = fVar54 * (float)uVar15 + -(float)uVar18 * fVar55;
    fVar55 = fVar54 * (float)uVar18 + (float)uVar15 * fVar55;
    (pcOut->mTransformation).c1 = fVar56 + fVar56;
    (pcOut->mTransformation).c2 = fVar55 + fVar55;
    (pcOut->mTransformation).c3 = 1.0 - (fVar64 + fVar64);
    (pcOut->mTransformation).c4 = 0.0;
    (pcOut->mTransformation).d1 = 0.0;
    (pcOut->mTransformation).d2 = 0.0;
    (pcOut->mTransformation).d3 = 0.0;
    (pcOut->mTransformation).d4 = 1.0;
  }
  paVar25 = (pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar25) {
    (pcOut->mTransformation).a1 = (paVar25->mValue).x * (pcOut->mTransformation).a1;
    (pcOut->mTransformation).b1 = (paVar25->mValue).x * (pcOut->mTransformation).b1;
    (pcOut->mTransformation).c1 = (paVar25->mValue).x * (pcOut->mTransformation).c1;
    (pcOut->mTransformation).a2 = (paVar25->mValue).y * (pcOut->mTransformation).a2;
    (pcOut->mTransformation).b2 = (paVar25->mValue).y * (pcOut->mTransformation).b2;
    (pcOut->mTransformation).c2 = (paVar25->mValue).y * (pcOut->mTransformation).c2;
    (pcOut->mTransformation).a3 = (paVar25->mValue).z * (pcOut->mTransformation).a3;
    (pcOut->mTransformation).b3 = (paVar25->mValue).z * (pcOut->mTransformation).b3;
    (pcOut->mTransformation).c3 = (paVar25->mValue).z * (pcOut->mTransformation).c3;
  }
  paVar25 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start;
  paVar44 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  paVar47 = paVar44;
  if (paVar44 != paVar25) {
    (pcOut->mTransformation).a4 = (paVar25->mValue).x + (pcOut->mTransformation).a4;
    (pcOut->mTransformation).b4 = (paVar25->mValue).y + (pcOut->mTransformation).b4;
    (pcOut->mTransformation).c4 = (paVar25->mValue).z + (pcOut->mTransformation).c4;
    paVar47 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    paVar44 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if ((((1 < (ulong)(((long)paVar44 - (long)paVar47 >> 3) * -0x5555555555555555)) ||
       (1 < (ulong)(((long)(pcIn->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pcIn->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
      (1 < (ulong)(((long)(pcIn->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pcIn->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
     ((0x10 < (ulong)((long)(pcIn->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pcIn->aCameraRollKeys).
                           super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                           ._M_impl.super__Vector_impl_data._M_start) ||
      (1 < (ulong)(((long)(pcIn->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pcIn->aTargetPositionKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))))) {
    paVar26 = *pcSOut->mAnimations;
    if (paVar26 == (aiAnimation *)0x0) {
      __assert_fail("nullptr != anim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/3DS/3DSConverter.cpp"
                    ,0x242,
                    "void Assimp::Discreet3DSImporter::AddNodeToGraph(aiScene *, aiNode *, D3DS::Node *, aiMatrix4x4 &)"
                   );
    }
    if (0x10 < (ulong)((long)(pcIn->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pcIn->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pLVar34 = DefaultLogger::get();
      Logger::debug(pLVar34,"3DS: Converting camera roll track ...");
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::resize
                (this_00,(long)(pcIn->aCameraRollKeys).
                               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcIn->aCameraRollKeys).
                               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      paVar37 = (pcIn->aCameraRollKeys).
                super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pcIn->aCameraRollKeys).
          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
          _M_impl.super__Vector_impl_data._M_finish != paVar37) {
        uVar42 = 0;
        uVar45 = 1;
        do {
          paVar36 = (pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar36[uVar42].mTime = paVar37[uVar42].mTime;
          fVar55 = paVar37[uVar42].mValue * 0.017453292 * 0.5;
          fVar54 = sinf(fVar55);
          fVar55 = cosf(fVar55);
          fVar56 = fVar55 * 0.0;
          paVar36[uVar42].mValue.w = fVar55 + fVar54 * 0.0;
          paVar36[uVar42].mValue.x = fVar54 - fVar56;
          paVar36[uVar42].mValue.y = fVar54 * 0.0 + fVar56;
          paVar36[uVar42].mValue.z = fVar54 * -0.0 + fVar56;
          paVar37 = (pcIn->aCameraRollKeys).
                    super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar53 = uVar45 < (ulong)((long)(pcIn->aCameraRollKeys).
                                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar37
                                   >> 4);
          uVar42 = uVar45;
          uVar45 = (ulong)((int)uVar45 + 1);
        } while (bVar53);
      }
    }
    uVar49 = pcSOut->mNumCameras;
    if (uVar49 != 0) {
      uVar42 = 0;
      do {
        paVar27 = pcSOut->mCameras[uVar42];
        uVar20 = (paVar27->mName).length;
        if ((uVar20 == (pcOut->mName).length) &&
           (iVar32 = bcmp((paVar27->mName).data,(pcOut->mName).data,(ulong)uVar20), iVar32 == 0)) {
          (paVar27->mLookAt).x = 0.0;
          (paVar27->mLookAt).y = 0.0;
          (paVar27->mLookAt).z = 1.0;
          uVar49 = pcSOut->mNumCameras;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < uVar49);
    }
    uVar49 = pcSOut->mNumLights;
    if (uVar49 != 0) {
      uVar42 = 0;
      do {
        paVar28 = pcSOut->mLights[uVar42];
        uVar20 = (paVar28->mName).length;
        if ((uVar20 == (pcOut->mName).length) &&
           (iVar32 = bcmp((paVar28->mName).data,(pcOut->mName).data,(ulong)uVar20), iVar32 == 0)) {
          (paVar28->mDirection).x = 0.0;
          (paVar28->mDirection).y = 0.0;
          (paVar28->mDirection).z = 1.0;
          uVar49 = pcSOut->mNumLights;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < uVar49);
    }
    paVar38 = (aiNodeAnim *)operator_new(0x438);
    (paVar38->mNodeName).length = 0;
    (paVar38->mNodeName).data[0] = '\0';
    memset((paVar38->mNodeName).data + 1,0x1b,0x3ff);
    paVar38->mRotationKeys = (aiQuatKey *)0x0;
    paVar38->mNumScalingKeys = 0;
    *(undefined8 *)&paVar38->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar38->mPositionKeys + 4) = 0;
    paVar38->mScalingKeys = (aiVectorKey *)0x0;
    paVar38->mPreState = aiAnimBehaviour_DEFAULT;
    paVar38->mPostState = aiAnimBehaviour_DEFAULT;
    uVar49 = paVar26->mNumChannels;
    paVar26->mNumChannels = uVar49 + 1;
    paVar26->mChannels[uVar49] = paVar38;
    uVar42 = (pcIn->mName)._M_string_length;
    if (uVar42 < 0x400) {
      (paVar38->mNodeName).length = (ai_uint32)uVar42;
      memcpy((paVar38->mNodeName).data,(pcIn->mName)._M_dataplus._M_p,uVar42);
      (paVar38->mNodeName).data[uVar42] = '\0';
    }
    paVar25 = (pcIn->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar46 = (long)(pcIn->aPositionKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)paVar25;
    if (lVar46 != 0) {
      uVar49 = (int)(lVar46 >> 3) * -0x55555555;
      paVar38->mNumPositionKeys = uVar49;
      uVar42 = (ulong)uVar49 * 0x18;
      paVar39 = (aiVectorKey *)operator_new__(uVar42);
      if ((ulong)uVar49 != 0) {
        uVar45 = 0;
        do {
          puVar4 = (undefined8 *)((long)&paVar39->mTime + uVar45);
          *puVar4 = 0;
          puVar4[1] = 0;
          *(undefined4 *)((long)&(paVar39->mValue).z + uVar45) = 0;
          uVar45 = uVar45 + 0x18;
        } while (uVar42 != uVar45);
      }
      paVar38->mPositionKeys = paVar39;
      memcpy(paVar39,paVar25,uVar42);
    }
    lVar46 = (long)(pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pcIn->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar46 != 0) {
      uVar42 = (lVar46 >> 3) * -0x5555555555555555;
      uVar49 = (uint)uVar42;
      paVar38->mNumRotationKeys = uVar49;
      uVar42 = uVar42 & 0xffffffff;
      paVar40 = (aiQuatKey *)operator_new__(uVar42 * 0x18);
      if (uVar42 != 0) {
        paVar48 = paVar40;
        do {
          paVar48->mTime = 0.0;
          (paVar48->mValue).w = 1.0;
          (paVar48->mValue).x = 0.0;
          (paVar48->mValue).y = 0.0;
          (paVar48->mValue).z = 0.0;
          paVar48 = paVar48 + 1;
        } while (paVar48 != paVar40 + uVar42);
      }
      paVar38->mRotationKeys = paVar40;
      if (uVar49 != 0) {
        fVar56 = 0.0;
        fVar57 = 0.0;
        fVar55 = 1.0;
        fVar54 = 0.0;
        lVar46 = 0;
        uVar42 = 0;
        do {
          paVar36 = (this_00->super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if (lVar46 == 0) {
            fVar16 = (paVar36->mValue).w;
            fVar19 = (paVar36->mValue).x;
            uVar60._0_4_ = (paVar36->mValue).y;
            uVar60._4_4_ = (paVar36->mValue).z;
          }
          else {
            uVar60 = *(undefined8 *)((long)&(paVar36->mValue).x + lVar46);
            fVar64 = (float)uVar60;
            fVar58 = (float)((ulong)uVar60 >> 0x20);
            fVar62 = *(float *)((long)&(paVar36->mValue).z + lVar46);
            fVar63 = *(float *)((long)&(paVar36->mValue).w + lVar46);
            uVar60 = *(undefined8 *)((long)&(paVar36->mValue).y + lVar46);
            fVar59 = (float)uVar60;
            fVar61 = (float)((ulong)uVar60 >> 0x20);
            fVar16 = (-fVar56 * fVar59 + fVar63 * fVar55 + -fVar54 * fVar64) - fVar62 * fVar57;
            fVar19 = (fVar56 * fVar61 + fVar64 * fVar55 + fVar63 * fVar54) - fVar58 * fVar57;
            uVar60 = CONCAT44((fVar54 * fVar58 + fVar55 * fVar61 + fVar63 * fVar57) -
                              fVar64 * fVar56,
                              (fVar57 * fVar64 + fVar55 * fVar59 + fVar63 * fVar56) -
                              fVar62 * fVar54);
          }
          *(undefined8 *)((long)&paVar38->mRotationKeys->mTime + lVar46) =
               *(undefined8 *)((long)&paVar36->mTime + lVar46);
          fVar55 = (float)uVar60;
          fVar63 = (float)((ulong)uVar60 >> 0x20);
          fVar62 = SQRT(fVar16 * fVar16 + fVar63 * fVar63 + fVar19 * fVar19 + fVar55 * fVar55);
          fVar54 = 1.0 / fVar62;
          fVar56 = fVar55 * fVar54;
          fVar57 = fVar63 * fVar54;
          if ((fVar62 == 0.0) && (!NAN(fVar62))) {
            fVar56 = fVar55;
            fVar57 = fVar63;
          }
          fVar55 = fVar54 * fVar16;
          fVar54 = fVar54 * fVar19;
          if ((fVar62 == 0.0) && (!NAN(fVar62))) {
            fVar55 = fVar16;
            fVar54 = fVar19;
          }
          pfVar3 = (float *)((long)&(paVar38->mRotationKeys->mValue).w + lVar46);
          *pfVar3 = fVar55;
          pfVar3[1] = fVar54;
          pfVar3[2] = fVar56;
          pfVar3[3] = fVar57;
          uVar42 = uVar42 + 1;
          lVar46 = lVar46 + 0x18;
        } while (uVar42 < paVar38->mNumRotationKeys);
      }
    }
    paVar25 = (pcIn->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar46 = (long)(pcIn->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)paVar25;
    if (lVar46 != 0) {
      uVar49 = (int)(lVar46 >> 3) * -0x55555555;
      paVar38->mNumScalingKeys = uVar49;
      uVar42 = (ulong)uVar49 * 0x18;
      paVar39 = (aiVectorKey *)operator_new__(uVar42);
      if ((ulong)uVar49 != 0) {
        uVar45 = 0;
        do {
          puVar4 = (undefined8 *)((long)&paVar39->mTime + uVar45);
          *puVar4 = 0;
          puVar4[1] = 0;
          *(undefined4 *)((long)&(paVar39->mValue).z + uVar45) = 0;
          uVar45 = uVar45 + 0x18;
        } while (uVar42 != uVar45);
      }
      paVar38->mScalingKeys = paVar39;
      memcpy(paVar39,paVar25,uVar42);
    }
  }
  pcOut->mNumChildren =
       (uint)((ulong)((long)(pcIn->mChildren).
                            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pcIn->mChildren).
                           super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar45 = (long)(pcIn->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pcIn->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  uVar42 = 0xffffffffffffffff;
  if (-1 < (long)uVar45) {
    uVar42 = uVar45;
  }
  ppaVar41 = (aiNode **)operator_new__(uVar42);
  pcOut->mChildren = ppaVar41;
  uVar42 = (ulong)((long)(pcIn->mChildren).
                         super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pcIn->mChildren).
                        super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar42 != 0) {
    uVar45 = 0;
    do {
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      pcOut->mChildren[uVar45] = this_01;
      pcOut->mChildren[uVar45]->mParent = pcOut;
      AddNodeToGraph(local_a0,pcSOut,pcOut->mChildren[uVar45],
                     (pcIn->mChildren).
                     super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar45],param_4);
      uVar45 = uVar45 + 1;
    } while ((uVar42 & 0xffffffff) != uVar45);
  }
  if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Discreet3DSImporter::AddNodeToGraph(aiScene* pcSOut,aiNode* pcOut,
    D3DS::Node* pcIn, aiMatrix4x4& /*absTrafo*/)
{
    std::vector<unsigned int> iArray;
    iArray.reserve(3);

    aiMatrix4x4 abs;

    // Find all meshes with the same name as the node
    for (unsigned int a = 0; a < pcSOut->mNumMeshes;++a)
    {
        const D3DS::Mesh* pcMesh = (const D3DS::Mesh*)pcSOut->mMeshes[a]->mColors[0];
        ai_assert(NULL != pcMesh);

        if (pcIn->mName == pcMesh->mName)
            iArray.push_back(a);
    }
    if (!iArray.empty())
    {
        // The matrix should be identical for all meshes with the
        // same name. It HAS to be identical for all meshes .....
        D3DS::Mesh* imesh = ((D3DS::Mesh*)pcSOut->mMeshes[iArray[0]]->mColors[0]);

        // Compute the inverse of the transformation matrix to move the
        // vertices back to their relative and local space
        aiMatrix4x4 mInv = imesh->mMat, mInvTransposed = imesh->mMat;
        mInv.Inverse();mInvTransposed.Transpose();
        aiVector3D pivot = pcIn->vPivot;

        pcOut->mNumMeshes = (unsigned int)iArray.size();
        pcOut->mMeshes = new unsigned int[iArray.size()];
        for (unsigned int i = 0;i < iArray.size();++i)  {
            const unsigned int iIndex = iArray[i];
            aiMesh* const mesh = pcSOut->mMeshes[iIndex];

            if (mesh->mColors[1] == NULL)
            {
                // Transform the vertices back into their local space
                // fixme: consider computing normals after this, so we don't need to transform them
                const aiVector3D* const pvEnd = mesh->mVertices + mesh->mNumVertices;
                aiVector3D* pvCurrent = mesh->mVertices, *t2 = mesh->mNormals;

                for (; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                    *pvCurrent = mInv * (*pvCurrent);
                    *t2 = mInvTransposed * (*t2);
                }

                // Handle negative transformation matrix determinant -> invert vertex x
                if (imesh->mMat.Determinant() < 0.0f)
                {
                    /* we *must* have normals */
                    for (pvCurrent = mesh->mVertices, t2 = mesh->mNormals; pvCurrent != pvEnd; ++pvCurrent, ++t2) {
                        pvCurrent->x *= -1.f;
                        t2->x *= -1.f;
                    }
                    ASSIMP_LOG_INFO("3DS: Flipping mesh X-Axis");
                }

                // Handle pivot point
                if (pivot.x || pivot.y || pivot.z)
                {
                    for (pvCurrent = mesh->mVertices; pvCurrent != pvEnd; ++pvCurrent)  {
                        *pvCurrent -= pivot;
                    }
                }

                mesh->mColors[1] = (aiColor4D*)1;
            }
            else
                mesh->mColors[1] = (aiColor4D*)1;

            // Setup the mesh index
            pcOut->mMeshes[i] = iIndex;
        }
    }

    // Setup the name of the node
    // First instance keeps its name otherwise something might break, all others will be postfixed with their instance number
    if (pcIn->mInstanceNumber > 1)
    {
        char tmp[12];
        ASSIMP_itoa10(tmp, pcIn->mInstanceNumber);
        std::string tempStr = pcIn->mName + "_inst_";
        tempStr += tmp;
        pcOut->mName.Set(tempStr);
    }
    else
        pcOut->mName.Set(pcIn->mName);

    // Now build the transformation matrix of the node
    // ROTATION
    if (pcIn->aRotationKeys.size()){

        // FIX to get to Assimp's quaternion conventions
        for (std::vector<aiQuatKey>::iterator it = pcIn->aRotationKeys.begin(); it != pcIn->aRotationKeys.end(); ++it) {
            (*it).mValue.w *= -1.f;
        }

        pcOut->mTransformation = aiMatrix4x4( pcIn->aRotationKeys[0].mValue.GetMatrix() );
    }
    else if (pcIn->aCameraRollKeys.size())
    {
        aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(- pcIn->aCameraRollKeys[0].mValue),
            pcOut->mTransformation);
    }

    // SCALING
    aiMatrix4x4& m = pcOut->mTransformation;
    if (pcIn->aScalingKeys.size())
    {
        const aiVector3D& v = pcIn->aScalingKeys[0].mValue;
        m.a1 *= v.x; m.b1 *= v.x; m.c1 *= v.x;
        m.a2 *= v.y; m.b2 *= v.y; m.c2 *= v.y;
        m.a3 *= v.z; m.b3 *= v.z; m.c3 *= v.z;
    }

    // TRANSLATION
    if (pcIn->aPositionKeys.size())
    {
        const aiVector3D& v = pcIn->aPositionKeys[0].mValue;
        m.a4 += v.x;
        m.b4 += v.y;
        m.c4 += v.z;
    }

    // Generate animation channels for the node
    if (pcIn->aPositionKeys.size()  > 1  || pcIn->aRotationKeys.size()   > 1 ||
        pcIn->aScalingKeys.size()   > 1  || pcIn->aCameraRollKeys.size() > 1 ||
        pcIn->aTargetPositionKeys.size() > 1)
    {
        aiAnimation* anim = pcSOut->mAnimations[0];
        ai_assert(nullptr != anim);

        if (pcIn->aCameraRollKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting camera roll track ...");

            // Camera roll keys - in fact they're just rotations
            // around the camera's z axis. The angles are given
            // in degrees (and they're clockwise).
            pcIn->aRotationKeys.resize(pcIn->aCameraRollKeys.size());
            for (unsigned int i = 0; i < pcIn->aCameraRollKeys.size();++i)
            {
                aiQuatKey&  q = pcIn->aRotationKeys[i];
                aiFloatKey& f = pcIn->aCameraRollKeys[i];

                q.mTime  = f.mTime;

                // FIX to get to Assimp quaternion conventions
                q.mValue = aiQuaternion(0.f,0.f,AI_DEG_TO_RAD( /*-*/ f.mValue));
            }
        }
#if 0
        if (pcIn->aTargetPositionKeys.size() > 1)
        {
            ASSIMP_LOG_DEBUG("3DS: Converting target track ...");

            // Camera or spot light - need to convert the separate
            // target position channel to our representation
            TargetAnimationHelper helper;

            if (pcIn->aPositionKeys.empty())
            {
                // We can just pass zero here ...
                helper.SetFixedMainAnimationChannel(aiVector3D());
            }
            else  helper.SetMainAnimationChannel(&pcIn->aPositionKeys);
            helper.SetTargetAnimationChannel(&pcIn->aTargetPositionKeys);

            // Do the conversion
            std::vector<aiVectorKey> distanceTrack;
            helper.Process(&distanceTrack);

            // Now add a new node as child, name it <ourName>.Target
            // and assign the distance track to it. This is that the
            // information where the target is and how it moves is
            // not lost
            D3DS::Node* nd = new D3DS::Node();
            pcIn->push_back(nd);

            nd->mName = pcIn->mName + ".Target";

            aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nda->mNodeName.Set(nd->mName);

            nda->mNumPositionKeys = (unsigned int)distanceTrack.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&distanceTrack[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }
#endif

        // Cameras or lights define their transformation in their parent node and in the
        // corresponding light or camera chunks. However, we read and process the latter
        // to to be able to return valid cameras/lights even if no scenegraph is given.
        for (unsigned int n = 0; n < pcSOut->mNumCameras;++n)   {
            if (pcSOut->mCameras[n]->mName == pcOut->mName) {
                pcSOut->mCameras[n]->mLookAt = aiVector3D(0.f,0.f,1.f);
            }
        }
        for (unsigned int n = 0; n < pcSOut->mNumLights;++n)    {
            if (pcSOut->mLights[n]->mName == pcOut->mName) {
                pcSOut->mLights[n]->mDirection = aiVector3D(0.f,0.f,1.f);
            }
        }

        // Allocate a new node anim and setup its name
        aiNodeAnim* nda = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
        nda->mNodeName.Set(pcIn->mName);

        // POSITION keys
        if (pcIn->aPositionKeys.size()  > 0)
        {
            nda->mNumPositionKeys = (unsigned int)pcIn->aPositionKeys.size();
            nda->mPositionKeys = new aiVectorKey[nda->mNumPositionKeys];
            ::memcpy(nda->mPositionKeys,&pcIn->aPositionKeys[0],
                sizeof(aiVectorKey)*nda->mNumPositionKeys);
        }

        // ROTATION keys
        if (pcIn->aRotationKeys.size()  > 0)
        {
            nda->mNumRotationKeys = (unsigned int)pcIn->aRotationKeys.size();
            nda->mRotationKeys = new aiQuatKey[nda->mNumRotationKeys];

            // Rotations are quaternion offsets
            aiQuaternion abs1;
            for (unsigned int n = 0; n < nda->mNumRotationKeys;++n)
            {
                const aiQuatKey& q = pcIn->aRotationKeys[n];

                abs1 = (n ? abs1 * q.mValue : q.mValue);
                nda->mRotationKeys[n].mTime  = q.mTime;
                nda->mRotationKeys[n].mValue = abs1.Normalize();
            }
        }

        // SCALING keys
        if (pcIn->aScalingKeys.size()  > 0)
        {
            nda->mNumScalingKeys = (unsigned int)pcIn->aScalingKeys.size();
            nda->mScalingKeys = new aiVectorKey[nda->mNumScalingKeys];
            ::memcpy(nda->mScalingKeys,&pcIn->aScalingKeys[0],
                sizeof(aiVectorKey)*nda->mNumScalingKeys);
        }
    }

    // Allocate storage for children
    pcOut->mNumChildren = (unsigned int)pcIn->mChildren.size();
    pcOut->mChildren = new aiNode*[pcIn->mChildren.size()];

    // Recursively process all children
    const unsigned int size = static_cast<unsigned int>(pcIn->mChildren.size());
    for (unsigned int i = 0; i < size;++i)
    {
        pcOut->mChildren[i] = new aiNode();
        pcOut->mChildren[i]->mParent = pcOut;
        AddNodeToGraph(pcSOut,pcOut->mChildren[i],pcIn->mChildren[i],abs);
    }
}